

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHarness_cTest.cpp
# Opt level: O0

void __thiscall
TEST_TestHarness_c_checkBoolText_TestShell::TEST_TestHarness_c_checkBoolText_TestShell
          (TEST_TestHarness_c_checkBoolText_TestShell *this)

{
  TEST_TestHarness_c_checkBoolText_TestShell *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)&PTR__TEST_TestHarness_c_checkBoolText_TestShell_00407c18;
  return;
}

Assistant:

TEST(TestHarness_c, checkBoolText)
{
    CHECK_EQUAL_C_BOOL_TEXT(1, 1, "Text");
    CHECK_EQUAL_C_BOOL_TEXT(1, 2, "Text");
    fixture->setTestFunction(failBoolTextMethod_);
    fixture->runAllTests();
    fixture->assertPrintContains("expected <true>\n\tbut was  <false>");
    fixture->assertPrintContains("arness_c");
    fixture->assertPrintContains("Message: BoolTestText");
    CHECK(!hasDestructorOfTheDestructorCheckedBeenCalled);
}